

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstr.c
# Opt level: O2

ssize_t mpt_memstr(iovec *data,size_t ndat,void *match,size_t mlen)

{
  ssize_t sVar1;
  int *piVar2;
  iovec tmp;
  
  if (mlen == 0) {
    sVar1 = 0;
  }
  else {
    tmp.iov_base = match;
    tmp.iov_len = mlen;
    if (match == (void *)0x0) {
      piVar2 = __errno_location();
      *piVar2 = 0xe;
      sVar1 = -1;
    }
    else {
      sVar1 = mpt_memfcn(data,ndat,memchr_wrap,&tmp);
    }
  }
  return sVar1;
}

Assistant:

extern ssize_t mpt_memstr(const struct iovec *data, size_t ndat, const void *match, size_t mlen)
{
	struct iovec	tmp;
	
	if ( !(tmp.iov_len = mlen) )
		return 0;
	
	if ( (tmp.iov_base = (void *) match) == NULL ) {
		errno = EFAULT; return -1;
	}
	return mpt_memfcn(data, ndat, (int (*)(int , void *)) memchr_wrap, &tmp);
}